

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

string * __thiscall
pfederc::ClassExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ClassExpr *this)

{
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *plVar1;
  _Head_base<0UL,_pfederc::Capabilities_*,_false> caps;
  _List_node_base *p_Var2;
  char cVar3;
  _List_node_base *p_Var4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  caps._M_head_impl =
       (this->super_Capable).caps._M_t.
       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>.
       _M_t.
       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
       super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
  if (caps._M_head_impl != (Capabilities *)0x0) {
    _capsToString_abi_cxx11_(&local_50,caps._M_head_impl);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->templs).
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->templs).
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _templateToString_abi_cxx11_(&local_50,&this->templs);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  cVar3 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar3);
  (*this->tokId->_vptr_Token[2])(&local_50,this->tokId,(this->super_Expr).lexer);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  plVar1 = &this->constructAttributes;
  p_Var4 = (_List_node_base *)plVar1;
  while( true ) {
    p_Var4 = (((_List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    p_Var2 = (plVar1->
             super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar1) break;
    if (p_Var4 == p_Var2) {
      std::__cxx11::string::push_back(cVar3);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    BiOpExpr::toString_abi_cxx11_(&local_50,(BiOpExpr *)p_Var4[1]._M_next);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (p_Var2 != (_List_node_base *)plVar1) {
    std::__cxx11::string::push_back(cVar3);
  }
  std::__cxx11::string::push_back(cVar3);
  p_Var4 = (_List_node_base *)&this->attributes;
  while (p_Var4 = (((_List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->attributes) {
    BiOpExpr::toString_abi_cxx11_(&local_50,(BiOpExpr *)p_Var4[1]._M_next);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::push_back(cVar3);
  }
  p_Var4 = (_List_node_base *)&this->functions;
  while (p_Var4 = (((_List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->functions) {
    FuncExpr::toString_abi_cxx11_(&local_50,(FuncExpr *)p_Var4[1]._M_next);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::push_back(cVar3);
  }
  std::__cxx11::string::push_back(cVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassExpr::toString() const noexcept {
  std::string result;
  if (caps)
    result += _capsToString(*caps);

  result += "class";
  if (!templs.empty()) {
    result += _templateToString(templs);
  }

  result += ' ';
  result += tokId->toString(getLexer());
  for (auto it = constructAttributes.begin();
      it != constructAttributes.end(); ++it) {
    if (it == constructAttributes.begin())
      result += '(';
    else
      result += ", ";

    result += (*it)->toString();
  }

  if (!constructAttributes.empty())
    result += ')';

  result += '\n';

  for (const auto &biopexpr : attributes) {
    result += biopexpr->toString();
    result += '\n';
  }

  for (const auto &function : functions) {
    result += function->toString();
    result += '\n';
  }

  result += ';';

  return result;
}